

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# species.cpp
# Opt level: O2

ostream * IO::operator<<(ostream *output,Species *species)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  poVar1 = std::operator<<(output,"(\n");
  poVar1 = std::operator<<(poVar1,"    Species: \n");
  poVar1 = std::operator<<(poVar1,"    (\n");
  poVar1 = std::operator<<(poVar1,"        Name      : \"");
  poVar1 = std::operator<<(poVar1,(string *)species);
  std::operator<<(poVar1,"\"\n");
  for (p_Var2 = (species->speciesComposition_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(species->speciesComposition_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(output,"        Element : ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::operator<<(poVar1," | Number : ");
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 2));
    std::operator<<(poVar1,"\n");
  }
  std::operator<<(output,"        Mol. Mass : ");
  poVar1 = std::ostream::_M_insert<double>(species->molecularWeight_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"    )\n");
  poVar1 = operator<<(poVar1,&species->transport_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = operator<<(poVar1,&species->thermo_);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,")");
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Species& species)
    {
        map<string,double>::const_iterator iter;

        output << "(\n"
               << "    Species: \n"
               << "    (\n"
               << "        Name      : \"" << species.name_ << "\"\n";
        for (iter = species.speciesComposition_.begin(); iter != species.speciesComposition_.end(); ++iter)
                {
        output << "        Element : " << iter->first << " | Number : " << iter->second << "\n";
        }
        output << "        Mol. Mass : " << species.molecularWeight_ << "\n"
               << "    )\n"
               << species.transport_ << "\n"
               << species.thermo_ << "\n"
               << ")";
        return output;
    }